

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdns.c
# Opt level: O0

size_t mdns_query_recv(int sock,void *buffer,size_t capacity,mdns_record_callback_fn callback,
                      void *user_data,uint8_t one_shot)

{
  uint16_t uVar1;
  int iVar2;
  ssize_t sVar3;
  uint16_t *puVar4;
  size_t sVar5;
  size_t local_a0;
  size_t offset;
  size_t records;
  size_t ofs;
  int i;
  uint16_t local_7c;
  uint16_t additional_rrs;
  uint16_t authority_rrs;
  uint16_t answer_rrs;
  uint16_t questions;
  uint16_t transaction_id;
  uint16_t *data;
  size_t data_size;
  int ret;
  socklen_t addrlen;
  sockaddr *saddr;
  sockaddr_in6 addr;
  uint8_t one_shot_local;
  void *user_data_local;
  mdns_record_callback_fn callback_local;
  size_t capacity_local;
  void *buffer_local;
  size_t sStack_10;
  int sock_local;
  
  _ret = (sockaddr *)&saddr;
  addr.sin6_addr.__in6_u.__u6_addr8[0xf] = one_shot;
  unique0x100001d5 = user_data;
  memset(&saddr,0,0x1c);
  _ret->sa_family = 2;
  data_size._4_4_ = 0x1c;
  sVar3 = recvfrom(sock,buffer,capacity,0,_ret,(socklen_t *)((long)&data_size + 4));
  data_size._0_4_ = (int)sVar3;
  if ((int)data_size < 1) {
    sStack_10 = 0;
  }
  else {
    data = (uint16_t *)(long)(int)data_size;
    _authority_rrs = (uint16_t *)((long)buffer + 2);
    additional_rrs = ntohs(*buffer);
    puVar4 = (uint16_t *)((long)_authority_rrs + 2);
    _authority_rrs = (uint16_t *)((long)_authority_rrs + 4);
    local_7c = ntohs(*puVar4);
    uVar1 = *_authority_rrs;
    _authority_rrs = _authority_rrs + 1;
    i._2_2_ = ntohs(uVar1);
    uVar1 = *_authority_rrs;
    _authority_rrs = _authority_rrs + 1;
    i._0_2_ = ntohs(uVar1);
    uVar1 = *_authority_rrs;
    _authority_rrs = _authority_rrs + 1;
    ofs._6_2_ = ntohs(uVar1);
    if ((addr.sin6_addr.__in6_u.__u6_addr8[0xf] == '\0') || (additional_rrs == mdns_transaction_id))
    {
      if (local_7c < 2) {
        for (ofs._0_4_ = 0; (int)ofs < (int)(uint)local_7c; ofs._0_4_ = (int)ofs + 1) {
          records = (long)_authority_rrs - (long)buffer;
          iVar2 = mdns_string_skip(buffer,(size_t)data,&records);
          if (iVar2 == 0) {
            return 0;
          }
          _authority_rrs = (uint16_t *)((long)buffer + records + 4);
        }
        offset = 0;
        local_a0 = (long)_authority_rrs - (long)buffer;
        sVar5 = mdns_records_parse((sockaddr *)_ret,buffer,(size_t)data,&local_a0,
                                   MDNS_ENTRYTYPE_ANSWER,(ulong)i._2_2_,callback,
                                   stack0xffffffffffffffc8);
        offset = sVar5 + offset;
        sVar5 = mdns_records_parse((sockaddr *)_ret,buffer,(size_t)data,&local_a0,
                                   MDNS_ENTRYTYPE_AUTHORITY,(ulong)(uint16_t)i,callback,
                                   stack0xffffffffffffffc8);
        offset = sVar5 + offset;
        sStack_10 = mdns_records_parse((sockaddr *)_ret,buffer,(size_t)data,&local_a0,
                                       MDNS_ENTRYTYPE_ADDITIONAL,(ulong)ofs._6_2_,callback,
                                       stack0xffffffffffffffc8);
        sStack_10 = sStack_10 + offset;
      }
      else {
        sStack_10 = 0;
      }
    }
    else {
      sStack_10 = 0;
    }
  }
  return sStack_10;
}

Assistant:

size_t
mdns_query_recv(int sock, void* buffer, size_t capacity,
                mdns_record_callback_fn callback, void* user_data,
                uint8_t one_shot) {
	struct sockaddr_in6 addr;
	struct sockaddr* saddr = (struct sockaddr*)&addr;
	memset(&addr, 0, sizeof(addr));
	saddr->sa_family = AF_INET;
#ifdef __APPLE__
	saddr->sa_len = sizeof(addr);
#endif
	socklen_t addrlen = sizeof(addr);
	int ret = recvfrom(sock, buffer, capacity, 0,
	                   saddr, &addrlen);
	if (ret <= 0)
		return 0;

	size_t data_size = (size_t)ret;
	uint16_t* data = (uint16_t*)buffer;

	uint16_t transaction_id = ntohs(*data++);
	++data;// uint16_t flags = ntohs(*data++);
	uint16_t questions      = ntohs(*data++);
	uint16_t answer_rrs     = ntohs(*data++);
	uint16_t authority_rrs  = ntohs(*data++);
	uint16_t additional_rrs = ntohs(*data++);

	if (one_shot && transaction_id != mdns_transaction_id)// || (flags != 0x8400))
		return 0; //Not a reply to our last question

	if (questions > 1)
		return 0;

	//Skip questions part
	int i;
	for (i = 0; i < questions; ++i) {
		size_t ofs = (size_t)((char*)data - (char*)buffer);
		if (!mdns_string_skip(buffer, data_size, &ofs))
			return 0;
		data = (uint16_t*)((char*)buffer + ofs);
		++data;
		++data;
	}

	size_t records = 0;
	size_t offset = (size_t)((char*)data - (char*)buffer);
	records += mdns_records_parse(saddr, buffer, data_size, &offset,
	                              MDNS_ENTRYTYPE_ANSWER, answer_rrs,
	                              callback, user_data);
	records += mdns_records_parse(saddr, buffer, data_size, &offset,
	                              MDNS_ENTRYTYPE_AUTHORITY, authority_rrs,
	                              callback, user_data);
	records += mdns_records_parse(saddr, buffer, data_size, &offset,
	                              MDNS_ENTRYTYPE_ADDITIONAL, additional_rrs,
	                              callback, user_data);
	return records;
}